

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O3

double __thiscall ddd::DictionaryMLT<false,_false>::ratio_singles(DictionaryMLT<false,_false> *this)

{
  DaTrie<false,_false,_true> *pDVar1;
  pointer puVar2;
  DaTrie<false,_false,_false> *pDVar3;
  uint32_t uVar4;
  unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  *subtrie;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar4 = DaTrie<false,_false,_true>::num_singles
                    ((this->prefix_subtrie_)._M_t.
                     super___uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                     .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl);
  uVar7 = (ulong)uVar4;
  pDVar1 = (this->prefix_subtrie_)._M_t.
           super___uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
           .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl;
  uVar6 = (ulong)((int)((ulong)((long)*(pointer *)
                                       ((long)&(pDVar1->bc_).
                                               super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>
                                       + 8) -
                               *(long *)&(pDVar1->bc_).
                                         super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>) >> 3
                       ) - pDVar1->bc_emps_);
  puVar2 = (this->suffix_subtries_).
           super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->suffix_subtries_).
                super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    pDVar3 = (puVar5->_M_t).
             super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
             .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl;
    if (pDVar3 != (DaTrie<false,_false,_false> *)0x0) {
      uVar4 = DaTrie<false,_false,_false>::num_singles(pDVar3);
      uVar7 = uVar7 + uVar4;
      pDVar3 = (puVar5->_M_t).
               super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
               .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl;
      uVar6 = uVar6 + ((int)((ulong)((long)*(pointer *)
                                            ((long)&(pDVar3->bc_).
                                                                                                        
                                                  super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>
                                            + 8) -
                                    *(long *)&(pDVar3->bc_).
                                              super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>)
                            >> 3) - pDVar3->bc_emps_);
    }
  }
  auVar8._8_4_ = (int)(uVar7 >> 0x20);
  auVar8._0_8_ = uVar7;
  auVar8._12_4_ = 0x45300000;
  auVar9._8_4_ = (int)(uVar6 >> 0x20);
  auVar9._0_8_ = uVar6;
  auVar9._12_4_ = 0x45300000;
  return ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) /
         ((auVar9._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
}

Assistant:

double ratio_singles() const { // not in constant time
    size_t num_singles = prefix_subtrie_->num_singles();
    size_t num_nodes = prefix_subtrie_->num_nodes();
    for (auto &subtrie : suffix_subtries_) {
      if (!subtrie) {
        continue;
      }
      num_singles += subtrie->num_singles();
      num_nodes += subtrie->num_nodes();
    }
    return static_cast<double>(num_singles) / num_nodes;
  }